

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_app.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  mbedtls_pk_type_t mVar4;
  char *pcVar5;
  FILE *__stream;
  size_t sVar6;
  long lVar7;
  mbedtls_mpi *X;
  char *pcVar8;
  char *__s1;
  ulong uVar9;
  int iVar10;
  mbedtls_pk_context pk;
  mbedtls_mpi E;
  mbedtls_mpi N;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  char buf [1024];
  mbedtls_pk_context mStack_508;
  mbedtls_mpi local_4f8;
  mbedtls_mpi local_4e0;
  mbedtls_mpi local_4c8;
  mbedtls_mpi local_4b0;
  mbedtls_mpi local_498;
  mbedtls_mpi local_480;
  mbedtls_mpi local_468;
  mbedtls_mpi local_450;
  char local_438 [1032];
  
  mbedtls_pk_init(&mStack_508);
  memset(local_438,0,0x400);
  mbedtls_mpi_init(&local_4e0);
  mbedtls_mpi_init(&local_450);
  mbedtls_mpi_init(&local_468);
  mbedtls_mpi_init(&local_480);
  mbedtls_mpi_init(&local_4f8);
  mbedtls_mpi_init(&local_498);
  mbedtls_mpi_init(&local_4b0);
  mbedtls_mpi_init(&local_4c8);
  if (argc == 0) {
LAB_0010b4a7:
    printf(
          "\n usage: key_app param=<>...\n\n acceptable parameters:\n    mode=private|public default: none\n    filename=%%s         default: keyfile.key\n    password=%%s         default: \"\"\n    password_file=%%s    default: \"\"\n\n"
          );
LAB_0010b4b5:
    iVar3 = 1;
  }
  else {
    opt.mode = 0;
    opt.filename = "keyfile.key";
    opt.password = anon_var_dwarf_1b863 + 9;
    opt.password_file = anon_var_dwarf_1b863 + 9;
    if (argc < 2) goto LAB_0010b4a7;
    uVar9 = 1;
    do {
      pcVar8 = argv[uVar9];
      pcVar5 = strchr(pcVar8,0x3d);
      if (pcVar5 == (char *)0x0) goto LAB_0010b4a7;
      __s1 = pcVar5 + 1;
      *pcVar5 = '\0';
      iVar3 = strcmp(pcVar8,"mode");
      if (iVar3 == 0) {
        iVar3 = strcmp(__s1,"private");
        if (iVar3 == 0) {
          opt.mode = 1;
          pcVar5 = opt.filename;
          pcVar1 = opt.password;
          pcVar2 = opt.password_file;
        }
        else {
          iVar3 = strcmp(__s1,"public");
          if (iVar3 != 0) goto LAB_0010b4a7;
          opt.mode = 2;
          pcVar5 = opt.filename;
          pcVar1 = opt.password;
          pcVar2 = opt.password_file;
        }
      }
      else {
        iVar3 = strcmp(pcVar8,"filename");
        pcVar5 = __s1;
        pcVar1 = opt.password;
        pcVar2 = opt.password_file;
        if (((iVar3 != 0) &&
            (iVar3 = strcmp(pcVar8,"password"), pcVar5 = opt.filename, pcVar1 = __s1,
            pcVar2 = opt.password_file, iVar3 != 0)) &&
           (iVar3 = strcmp(pcVar8,"password_file"), pcVar5 = opt.filename, pcVar1 = opt.password,
           pcVar2 = __s1, iVar3 != 0)) goto LAB_0010b4a7;
      }
      opt.password_file = pcVar2;
      opt.password = pcVar1;
      opt.filename = pcVar5;
      uVar9 = uVar9 + 1;
    } while ((uint)argc != uVar9);
    if (opt.mode != 2) {
      if (opt.mode != 1) goto LAB_0010b4a7;
      if (*opt.password != '\0') {
        if (*opt.password_file != '\0') {
          puts("Error: cannot have both password and password_file");
          goto LAB_0010b4a7;
        }
LAB_0010b663:
        printf("\n  . Loading the private key ...");
        fflush(_stdout);
        iVar3 = mbedtls_pk_parse_keyfile(&mStack_508,opt.filename,opt.password);
        if (iVar3 != 0) {
          pcVar8 = " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x\n";
          goto LAB_0010b6ab;
        }
        puts(" ok");
        puts("  . Key information    ...");
        mVar4 = mbedtls_pk_get_type(&mStack_508);
        if (mVar4 == MBEDTLS_PK_RSA) {
          iVar3 = mbedtls_rsa_export((mbedtls_rsa_context *)mStack_508.pk_ctx,&local_4e0,&local_450,
                                     &local_468,&local_480,&local_4f8);
          if ((iVar3 != 0) ||
             (iVar3 = mbedtls_rsa_export_crt
                                ((mbedtls_rsa_context *)mStack_508.pk_ctx,&local_498,&local_4b0,
                                 &local_4c8), iVar3 != 0)) goto LAB_0010b82e;
          iVar3 = mbedtls_mpi_write_file("N:  ",&local_4e0,0x10,(FILE *)0x0);
          if (((iVar3 == 0) &&
              ((((iVar3 = mbedtls_mpi_write_file("E:  ",&local_4f8,0x10,(FILE *)0x0), iVar3 == 0 &&
                 (iVar3 = mbedtls_mpi_write_file("D:  ",&local_480,0x10,(FILE *)0x0), iVar3 == 0))
                && (iVar3 = mbedtls_mpi_write_file("P:  ",&local_450,0x10,(FILE *)0x0), iVar3 == 0))
               && ((iVar3 = mbedtls_mpi_write_file("Q:  ",&local_468,0x10,(FILE *)0x0), iVar3 == 0
                   && (iVar3 = mbedtls_mpi_write_file("DP: ",&local_498,0x10,(FILE *)0x0),
                      iVar3 == 0)))))) &&
             (iVar3 = mbedtls_mpi_write_file("DQ:  ",&local_4b0,0x10,(FILE *)0x0), iVar3 == 0)) {
            pcVar8 = "QP:  ";
            X = &local_4c8;
LAB_0010b79e:
            iVar10 = 0;
            iVar3 = mbedtls_mpi_write_file(pcVar8,X,0x10,(FILE *)0x0);
            if (iVar3 == 0) goto LAB_0010b4e8;
          }
        }
        else {
          mVar4 = mbedtls_pk_get_type(&mStack_508);
          if (mVar4 != MBEDTLS_PK_ECKEY) goto LAB_0010b8df;
          iVar3 = mbedtls_mpi_write_file
                            ("Q(X): ",(mbedtls_mpi *)
                                      &((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x100))->p,0x10,
                             (FILE *)0x0);
          if (((iVar3 == 0) &&
              (iVar3 = mbedtls_mpi_write_file
                                 ("Q(Y): ",(mbedtls_mpi *)
                                           &((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x118))->p,
                                  0x10,(FILE *)0x0), iVar3 == 0)) &&
             (iVar3 = mbedtls_mpi_write_file
                                ("Q(Z): ",(mbedtls_mpi *)
                                          &((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x130))->p,
                                 0x10,(FILE *)0x0), iVar3 == 0)) {
            X = (mbedtls_mpi *)&((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0xe8))->p;
            pcVar8 = "D   : ";
            goto LAB_0010b79e;
          }
        }
        goto LAB_0010b4ba;
      }
      if (*opt.password_file == '\0') goto LAB_0010b663;
      printf("\n  . Loading the password file ...");
      __stream = fopen(opt.password_file,"rb");
      if (__stream == (FILE *)0x0) {
        pcVar8 = " failed\n  !  fopen returned NULL";
      }
      else {
        pcVar8 = fgets(local_438,0x400,__stream);
        fclose(__stream);
        if (pcVar8 != (char *)0x0) {
          sVar6 = strlen(local_438);
          lVar7 = (long)((sVar6 << 0x20) + -0x100000000) >> 0x20;
          if (local_438[lVar7] == '\n') {
            local_438[lVar7] = '\0';
          }
          lVar7 = (long)((sVar6 << 0x20) + -0x200000000) >> 0x20;
          opt.password = local_438;
          if (local_438[lVar7] == '\r') {
            local_438[lVar7] = '\0';
          }
          goto LAB_0010b663;
        }
        pcVar8 = "Error: fgets() failed to retrieve password";
      }
      puts(pcVar8);
      goto LAB_0010b4b5;
    }
    printf("\n  . Loading the public key ...");
    fflush(_stdout);
    iVar3 = mbedtls_pk_parse_public_keyfile(&mStack_508,opt.filename);
    if (iVar3 == 0) {
      puts(" ok");
      puts("  . Key information    ...");
      mVar4 = mbedtls_pk_get_type(&mStack_508);
      if (mVar4 != MBEDTLS_PK_RSA) {
        mVar4 = mbedtls_pk_get_type(&mStack_508);
        if (mVar4 == MBEDTLS_PK_ECKEY) {
          iVar3 = mbedtls_mpi_write_file
                            ("Q(X): ",(mbedtls_mpi *)
                                      &((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x100))->p,0x10,
                             (FILE *)0x0);
          if ((iVar3 == 0) &&
             (iVar3 = mbedtls_mpi_write_file
                                ("Q(Y): ",(mbedtls_mpi *)
                                          &((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x118))->p,
                                 0x10,(FILE *)0x0), iVar3 == 0)) {
            X = (mbedtls_mpi *)&((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x130))->p;
            pcVar8 = "Q(Z): ";
            goto LAB_0010b79e;
          }
          goto LAB_0010b4ba;
        }
LAB_0010b8df:
        puts("Do not know how to print key information for this type");
        iVar3 = 0;
        goto LAB_0010b4ba;
      }
      iVar3 = mbedtls_rsa_export((mbedtls_rsa_context *)mStack_508.pk_ctx,&local_4e0,
                                 (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&local_4f8
                                );
      if (iVar3 == 0) {
        iVar3 = mbedtls_mpi_write_file("N:  ",&local_4e0,0x10,(FILE *)0x0);
        if (iVar3 != 0) goto LAB_0010b4ba;
        pcVar8 = "E:  ";
        X = &local_4f8;
        goto LAB_0010b79e;
      }
LAB_0010b82e:
      puts(" failed\n  ! could not export RSA parameters\n");
      goto LAB_0010b4ba;
    }
    pcVar8 = " failed\n  !  mbedtls_pk_parse_public_keyfile returned -0x%04x\n";
LAB_0010b6ab:
    printf(pcVar8,(ulong)(uint)-iVar3);
  }
LAB_0010b4ba:
  mbedtls_strerror(iVar3,local_438,0x400);
  printf("  !  Last error was: %s\n",local_438);
  iVar10 = 1;
LAB_0010b4e8:
  mbedtls_pk_free(&mStack_508);
  mbedtls_mpi_free(&local_4e0);
  mbedtls_mpi_free(&local_450);
  mbedtls_mpi_free(&local_468);
  mbedtls_mpi_free(&local_480);
  mbedtls_mpi_free(&local_4f8);
  mbedtls_mpi_free(&local_498);
  mbedtls_mpi_free(&local_4b0);
  mbedtls_mpi_free(&local_4c8);
  return iVar10;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    char buf[1024];
    int i;
    char *p, *q;

    mbedtls_pk_context pk;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;

    /*
     * Set to sane values
     */
    mbedtls_pk_init( &pk );
    memset( buf, 0, sizeof(buf) );

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        goto cleanup;
    }

    opt.mode                = DFL_MODE;
    opt.filename            = DFL_FILENAME;
    opt.password            = DFL_PASSWORD;
    opt.password_file       = DFL_PASSWORD_FILE;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.mode = MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.mode = MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "password" ) == 0 )
            opt.password = q;
        else if( strcmp( p, "password_file" ) == 0 )
            opt.password_file = q;
        else
            goto usage;
    }

    if( opt.mode == MODE_PRIVATE )
    {
        if( strlen( opt.password ) && strlen( opt.password_file ) )
        {
            mbedtls_printf( "Error: cannot have both password and password_file\n" );
            goto usage;
        }

        if( strlen( opt.password_file ) )
        {
            FILE *f;

            mbedtls_printf( "\n  . Loading the password file ..." );
            if( ( f = fopen( opt.password_file, "rb" ) ) == NULL )
            {
                mbedtls_printf( " failed\n  !  fopen returned NULL\n" );
                goto cleanup;
            }
            if( fgets( buf, sizeof(buf), f ) == NULL )
            {
                fclose( f );
                mbedtls_printf( "Error: fgets() failed to retrieve password\n" );
                goto cleanup;
            }
            fclose( f );

            i = (int) strlen( buf );
            if( buf[i - 1] == '\n' ) buf[i - 1] = '\0';
            if( buf[i - 2] == '\r' ) buf[i - 2] = '\0';
            opt.password = buf;
        }

        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the private key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_keyfile( &pk, opt.filename, opt.password );

        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x\n", -ret );
            goto cleanup;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );
#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( pk );

            if( ( ret = mbedtls_rsa_export    ( rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
                ( ret = mbedtls_rsa_export_crt( rsa, &DP, &DQ, &QP ) )      != 0 )
            {
                mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
                goto cleanup;
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "N:  ", &N, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "E:  ", &E, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "D:  ", &D, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "P:  ", &P, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q:  ", &Q, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "DP: ", &DP, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "DQ:  ", &DQ, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "QP:  ", &QP, 16, NULL ) );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( pk );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "D   : ", &ecp->d  , 16, NULL ) );
        }
        else
#endif
        {
            mbedtls_printf("Do not know how to print key information for this type\n" );
            goto cleanup;
        }
    }
    else if( opt.mode == MODE_PUBLIC )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the public key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_public_keyfile( &pk, opt.filename );

        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_public_keyfile returned -0x%04x\n", -ret );
            goto cleanup;
        }

        mbedtls_printf( " ok\n" );

        mbedtls_printf( "  . Key information    ...\n" );
#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( pk );

            if( ( ret = mbedtls_rsa_export( rsa, &N, NULL, NULL,
                                            NULL, &E ) ) != 0 )
            {
                mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
                goto cleanup;
            }
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "N:  ", &N, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "E:  ", &E, 16, NULL ) );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( pk );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL ) );
        }
        else
#endif
        {
            mbedtls_printf("Do not know how to print key information for this type\n" );
            goto cleanup;
        }
    }
    else
        goto usage;

    exit_code = MBEDTLS_EXIT_SUCCESS;

cleanup:

#if defined(MBEDTLS_ERROR_C)
    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( "  !  Last error was: %s\n", buf );
    }
#endif

    mbedtls_pk_free( &pk );
    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}